

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O3

Code * __thiscall r_exec::HLPBindingMap::bind_pattern(HLPBindingMap *this,Code *pattern)

{
  _Object *p_Var1;
  bool bVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined4 extraout_var;
  Code *pCVar8;
  undefined4 extraout_var_00;
  Code *pattern_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Atom p_atom;
  uint16_t extent_index;
  undefined4 local_44;
  undefined2 local_3e;
  undefined4 local_3c;
  HLPBindingMap *local_38;
  
  bVar2 = need_binding(this,pattern);
  pCVar8 = pattern;
  if (bVar2) {
    plVar7 = (long *)r_code::Mem::Get();
    iVar5 = (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
    local_3c = *(undefined4 *)CONCAT44(extraout_var,iVar5);
    pCVar8 = (Code *)(**(code **)(*plVar7 + 0x50))(plVar7);
    r_code::Atom::~Atom((Atom *)&local_3c);
    iVar5 = (*(pattern->super__Object)._vptr__Object[10])(pattern);
    if ((short)iVar5 != 0) {
      uVar9 = 0;
      do {
        uVar9 = uVar9 & 0xffff;
        iVar5 = (*(pattern->super__Object)._vptr__Object[9])(pattern,(ulong)uVar9);
        pattern_00 = (Code *)CONCAT44(extraout_var_00,iVar5);
        bVar2 = need_binding(this,pattern_00);
        if (bVar2) {
          pattern_00 = bind_pattern(this,pattern_00);
        }
        (*(pCVar8->super__Object)._vptr__Object[8])(pCVar8,(ulong)uVar9,pattern_00);
        uVar9 = uVar9 + 1;
        iVar5 = (*(pattern->super__Object)._vptr__Object[10])(pattern);
      } while ((ushort)uVar9 < (ushort)iVar5);
    }
    local_38 = this;
    iVar5 = (*(pattern->super__Object)._vptr__Object[6])(pattern);
    local_3e = (undefined2)iVar5;
    iVar5 = (*(pattern->super__Object)._vptr__Object[6])(pattern);
    if (1 < (ushort)iVar5) {
      uVar11 = 1;
      uVar9 = 1;
      do {
        uVar10 = uVar11 & 0xffff;
        iVar5 = (*(pattern->super__Object)._vptr__Object[4])(pattern,(ulong)uVar10);
        local_44 = *(undefined4 *)CONCAT44(extraout_var_01,iVar5);
        bVar3 = r_code::Atom::getDescriptor();
        if (bVar3 - 0xc6 < 2) {
          iVar5 = (*(pCVar8->super__Object)._vptr__Object[4])(pCVar8,(ulong)uVar10);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar5),(Atom *)&local_44);
          bVar3 = r_code::Atom::getAtomCount();
          uVar9 = uVar9 + bVar3;
          while( true ) {
            uVar11 = uVar11 + 1;
            uVar10 = uVar11 & 0xffff;
            if (uVar9 < uVar10) break;
            iVar5 = (*(pattern->super__Object)._vptr__Object[4])(pattern,(ulong)uVar10);
            iVar6 = (*(pCVar8->super__Object)._vptr__Object[4])(pCVar8,(ulong)uVar10);
            r_code::Atom::operator=
                      ((Atom *)CONCAT44(extraout_var_04,iVar6),
                       (Atom *)CONCAT44(extraout_var_03,iVar5));
          }
        }
        else {
          uVar9 = uVar11;
          if (bVar3 == 0x86) {
            uVar4 = r_code::Atom::asIndex();
            p_Var1 = (local_38->super_BindingMap).map.
                     super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4].object;
            (*p_Var1->_vptr__Object[3])(p_Var1,pCVar8,(ulong)uVar10,&local_3e);
          }
          else {
            iVar5 = (*(pCVar8->super__Object)._vptr__Object[4])(pCVar8,(ulong)uVar10);
            r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar5),(Atom *)&local_44);
          }
        }
        r_code::Atom::~Atom((Atom *)&local_44);
        uVar11 = uVar9 + 1;
        uVar9 = uVar11 & 0xffff;
        iVar5 = (*(pattern->super__Object)._vptr__Object[6])(pattern);
      } while ((ushort)uVar11 < (ushort)iVar5);
    }
  }
  return pCVar8;
}

Assistant:

Code *HLPBindingMap::bind_pattern(Code *pattern) const
{
    if (!need_binding(pattern)) {
        return pattern;
    }

    Code *bound_pattern = _Mem::Get()->build_object(pattern->code(0));

    for (uint16_t i = 0; i < pattern->references_size(); ++i) { // bind references when needed; must be done before binding the code as this may add references.
        Code *reference = pattern->get_reference(i);

        if (need_binding(reference)) {
            bound_pattern->set_reference(i, bind_pattern(reference));
        } else {
            bound_pattern->set_reference(i, reference);
        }
    }

    uint16_t extent_index = pattern->code_size();

    for (uint16_t i = 1; i < pattern->code_size(); ++i) { // transform code containing variables into actual values when they exist: objects -> r_ptr, structures -> i_ptr, atoms -> atoms.
        Atom p_atom = pattern->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::VL_PTR:
            map[p_atom.asIndex()]->valuate(bound_pattern, i, extent_index);
            break;

        case Atom::TIMESTAMP:
        case Atom::STRING: { // avoid misinterpreting raw data that could be lead by descriptors.
            bound_pattern->code(i) = p_atom;
            uint16_t atom_count = p_atom.getAtomCount();

            for (uint16_t j = i + 1; j <= i + atom_count; ++j) {
                bound_pattern->code(j) = pattern->code(j);
            }

            i += atom_count;
            break;
        }

        default:
            bound_pattern->code(i) = p_atom;
            break;
        }
    }

    return bound_pattern;
}